

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O2

size_t printDisp8(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm,long MyNumber)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  char *pFormat;
  
  if (((pMyDisasm->Reserved_).EVEX.state == '\x01') &&
     ((pMyDisasm->Reserved_).EVEX.tupletype != '\0')) {
    lVar1 = getDisp8N(pMyDisasm);
    lVar2 = 1;
    if (lVar1 != -1) {
      lVar2 = lVar1;
    }
    MyNumber = MyNumber * lVar2;
  }
  if ((((pMyDisasm->Reserved_).RM_ == 4) && ((pMyDisasm->Reserved_).BASE_ == 4)) &&
     (0x1f < (pMyDisasm->Reserved_).Architecture)) {
    if ((pMyDisasm->Instruction).Opcode == 0x8f) {
      lVar2 = (long)((pMyDisasm->Reserved_).OperandSize / 8);
    }
    else {
      lVar2 = 0;
    }
    MyNumber = MyNumber + lVar2;
  }
  if (MyNumber < 0) {
    (pMyOperand->OpMnemonic + i)[0] = '-';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    pFormat = "%.4X";
    if (MyNumber + 0x7eU < 0xfe) {
      pFormat = "%.2X";
    }
    MyNumber = -MyNumber;
  }
  else {
    (pMyOperand->OpMnemonic + i)[0] = '+';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    pFormat = "%.4X";
    if ((ulong)MyNumber < 0x80) {
      pFormat = "%.2X";
    }
  }
  sVar3 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i + 1,pFormat,MyNumber);
  return sVar3 + i + 1;
}

Assistant:

size_t __bea_callspec__ printDisp8(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm, long MyNumber)
{
  size_t j;
  long N;

  if ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.tupletype != 0)) {
    N = getDisp8N(pMyDisasm);
    if (N != -1) MyNumber = MyNumber * N;
  }
  if ((GV.RM_ == 4) && (GV.BASE_ == 4) && (GV.Architecture >=32)) {
    MyNumber += specificPop(pMyDisasm);
  }
  if (MyNumber < 0) {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "-");
    #endif
    i++;
    j=i;
    #ifndef BEA_LIGHT_DISASSEMBLY
       i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j, getNumFormat(MyNumber), (Int64) ~MyNumber+1);
    #endif
  }
  else {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "+");
    #endif
    i ++;
    j=i;
    #ifndef BEA_LIGHT_DISASSEMBLY
       i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j, getNumFormat(MyNumber), (Int64) MyNumber);
    #endif
  }
  return i;
}